

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

chunk_conflict * modified_chunk(player *p,wchar_t height,wchar_t width,_Bool persistent)

{
  wchar_t wVar1;
  wchar_t m;
  bool bVar2;
  room_profile profile_00;
  _Bool _Var3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  _Bool **pp_Var7;
  _Bool *p_Var8;
  undefined8 uStack_88;
  room_profile profile;
  chunk_conflict *c;
  wchar_t n_attempt;
  wchar_t dun_unusual;
  wchar_t num_rooms;
  wchar_t num_floors;
  wchar_t rarity;
  wchar_t key;
  wchar_t bx;
  wchar_t by;
  wchar_t i;
  _Bool persistent_local;
  wchar_t width_local;
  wchar_t height_local;
  player *p_local;
  
  wVar1 = dun->profile->n_room_profiles;
  m = dun->profile->dun_unusual;
  profile._48_8_ = cave_new(height,width);
  ((chunk_conflict *)profile._48_8_)->depth = (int)p->depth;
  ((chunk_conflict *)profile._48_8_)->place = (int)p->place;
  uVar4 = (((chunk_conflict *)profile._48_8_)->height * ((chunk_conflict *)profile._48_8_)->width) /
          7;
  if (((player->opts).opt[0x18] & 1U) != 0) {
    msg("height=%d  width=%d  nfloors=%d",(ulong)(uint)((chunk_conflict *)profile._48_8_)->height,
        (ulong)(uint)((chunk_conflict *)profile._48_8_)->width,(ulong)uVar4);
  }
  fill_rectangle((chunk_conflict *)profile._48_8_,L'\0',L'\0',
                 *(int *)(profile._48_8_ + 0x24) + L'\xffffffff',
                 *(int *)(profile._48_8_ + 0x28) + L'\xffffffff',FEAT_GRANITE,L'\0');
  draw_rectangle((chunk_conflict *)profile._48_8_,L'\0',L'\0',
                 *(int *)(profile._48_8_ + 0x24) + L'\xffffffff',
                 *(int *)(profile._48_8_ + 0x28) + L'\xffffffff',FEAT_PERM,L'\0',true);
  dun->row_blocks = *(int *)(profile._48_8_ + 0x24) / dun->block_hgt;
  dun->col_blocks = *(int *)(profile._48_8_ + 0x28) / dun->block_wid;
  pp_Var7 = (_Bool **)mem_zalloc((long)dun->row_blocks << 3);
  dun->room_map = pp_Var7;
  for (bx = L'\0'; bx < dun->row_blocks; bx = bx + L'\x01') {
    p_Var8 = (_Bool *)mem_zalloc((long)dun->col_blocks);
    dun->room_map[bx] = p_Var8;
  }
  dun->pit_num = L'\0';
  dun->cent_n = L'\0';
  reset_entrance_data((chunk_conflict *)profile._48_8_);
  if (persistent) {
    build_staircase_rooms((chunk_conflict *)profile._48_8_,"Modified Generation");
  }
  c._0_4_ = 0;
  while ((*(int *)(*(long *)(profile._48_8_ + 0x30) + (long)FEAT_FLOOR * 4) < (int)uVar4 ||
         (dun->cent_n < L'\x02'))) {
    if (500 < (int)c) {
      uncreate_artifacts((chunk_conflict *)profile._48_8_);
      wipe_mon_list((chunk *)profile._48_8_,p);
      cave_free((chunk_conflict *)profile._48_8_);
      return (chunk_conflict *)0x0;
    }
    c._0_4_ = (int)c + 1;
    uVar5 = Rand_div(100);
    bx = L'\0';
    num_rooms = L'\0';
    while( true ) {
      bVar2 = false;
      if (bx == num_rooms) {
        bVar2 = bx < dun->profile->max_rarity;
      }
      if (!bVar2) break;
      uVar6 = Rand_div(m);
      if ((int)uVar6 < *(int *)(profile._48_8_ + 0xc) / 2 + 0x32) {
        num_rooms = num_rooms + L'\x01';
      }
      bx = bx + L'\x01';
    }
    bx = L'\0';
    while ((bx < wVar1 &&
           (((memcpy(&uStack_88,dun->profile->room_profiles + bx,0x38), num_rooms < profile.level ||
             ((int)profile._40_4_ <= (int)uVar5)) ||
            (profile_00._52_4_ = profile.rarity, profile_00.cutoff = profile._40_4_,
            profile_00.rarity = profile.level, profile_00._40_4_ = profile.width,
            profile_00.name._0_4_ = (int)profile.next, profile_00.next = (room_profile *)uStack_88,
            profile_00.name._4_4_ = (int)((ulong)profile.next >> 0x20),
            profile_00.builder = (room_builder_conflict)profile.name,
            profile_00._24_8_ = profile.builder, profile_00.width = profile.rating,
            profile_00.level = profile.height,
            _Var3 = room_build((chunk_conflict *)profile._48_8_,L'\0',L'\0',profile_00,true), !_Var3
            ))))) {
      bx = bx + L'\x01';
    }
  }
  for (bx = L'\0'; bx < dun->row_blocks; bx = bx + L'\x01') {
    mem_free(dun->room_map[bx]);
  }
  mem_free(dun->room_map);
  do_traditional_tunneling((chunk_conflict *)profile._48_8_);
  ensure_connectedness((chunk_conflict *)profile._48_8_,true);
  draw_rectangle((chunk_conflict *)profile._48_8_,L'\0',L'\0',
                 *(int *)(profile._48_8_ + 0x24) + L'\xffffffff',
                 *(int *)(profile._48_8_ + 0x28) + L'\xffffffff',FEAT_GRANITE,L'\0',true);
  return (chunk_conflict *)profile._48_8_;
}

Assistant:

static struct chunk *modified_chunk(struct player *p, int height, int width,
									bool persistent)
{
	int i;
	int by = 0, bx = 0, key, rarity;
	int num_floors;
	int num_rooms = dun->profile->n_room_profiles;
	int dun_unusual = dun->profile->dun_unusual;
	int n_attempt;

	/* Make the cave */
	struct chunk *c = cave_new(height, width);
	c->depth = p->depth;
	c->place = p->place;

	/* Set the intended number of floor grids based on cave floor area */
	num_floors = c->height * c->width / 7;
	ROOM_LOG("height=%d  width=%d  nfloors=%d", c->height, c->width,num_floors);

	/* Fill cave area with basic granite */
	fill_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_GRANITE, SQUARE_NONE);

	/* Generate permanent walls around the generated area (temporarily!) */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_PERM, SQUARE_NONE, true);

	/* Actual maximum number of blocks on this level */
	dun->row_blocks = c->height / dun->block_hgt;
	dun->col_blocks = c->width / dun->block_wid;

	/* Initialize the room table */
	dun->room_map = mem_zalloc(dun->row_blocks * sizeof(bool*));
	for (i = 0; i < dun->row_blocks; i++)
		dun->room_map[i] = mem_zalloc(dun->col_blocks * sizeof(bool));

	/* No rooms yet, pits or otherwise. */
	dun->pit_num = 0;
	dun->cent_n = 0;
	reset_entrance_data(c);

	/* Build the special staircase rooms */
	if (persistent) {
		build_staircase_rooms(c, "Modified Generation");
	}

	/*
	 * Build rooms until we have enough floor grids and at least two rooms
	 * or we appear to be stuck and can't match those criteria.
	 */
	n_attempt = 0;
	while (1) {
		if (c->feat_count[FEAT_FLOOR] >= num_floors
				&& dun->cent_n >= 2) {
			break;
		}
		/*
		 * At an average of roughly 22 successful rooms per level
		 * (and a standard deviation of 4.5 or so for that) and a
		 * room failure rate that's less than .5 failures per success
		 * (4.2.x profile doesn't use full allocation for rarity two
		 * rooms - only up to 60; and the last type tried in that
		 * rarity has a failure rate per successful rooms of all types
		 * of around .024).  500 attempts is a generous cutoff for
		 * saying no further progress is likely.
		 */
		if (n_attempt > 500) {
			uncreate_artifacts(c);
			wipe_mon_list(c, p);
			cave_free(c);
			return NULL;
		}
		++n_attempt;

		/* Roll for random key (to be compared against a profile's cutoff) */
		key = randint0(100);

		/* We generate a rarity number to figure out how exotic to make
		 * the room. This number has a (50+depth/2)/DUN_UNUSUAL chance
		 * of being > 0, a (50+depth/2)^2/DUN_UNUSUAL^2 chance of
		 * being > 1, up to MAX_RARITY. */
		i = 0;
		rarity = 0;
		while (i == rarity && i < dun->profile->max_rarity) {
			if (randint0(dun_unusual) < 50 + c->depth / 2) rarity++;
			i++;
		}

		/* Once we have a key and a rarity, we iterate through out list of
		 * room profiles looking for a match (whose cutoff > key and whose
		 * rarity > this rarity). We try building the room, and if it works
		 * then we are done with this iteration. We keep going until we find
		 * a room that we can build successfully or we exhaust the profiles. */
		for (i = 0; i < num_rooms; i++) {
			struct room_profile profile = dun->profile->room_profiles[i];
			if (profile.rarity > rarity) continue;
			if (profile.cutoff <= key) continue;
			if (room_build(c, by, bx, profile, true)) break;
		}
	}

	for (i = 0; i < dun->row_blocks; i++)
		mem_free(dun->room_map[i]);
	mem_free(dun->room_map);

	/* Connect all the rooms together */
	do_traditional_tunneling(c);
	ensure_connectedness(c, true);

	/* Turn the outer permanent walls back to granite */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_GRANITE, SQUARE_NONE, true);

	return c;
}